

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unzip.c
# Opt level: O0

int unz64local_GetCurrentFileInfoInternal
              (unzFile file,unz_file_info64 *pfile_info,
              unz_file_info64_internal *pfile_info_internal,char *szFileName,
              uLong fileNameBufferSize,void *extraField,uLong extraFieldBufferSize,char *szComment,
              uLong commentBufferSize)

{
  int iVar1;
  long lVar2;
  ZPOS64_T ZVar3;
  uLong uVar4;
  uLong local_128;
  uLong uSizeRead_2;
  uLong dataSize;
  uLong headerId;
  uLong acc;
  ZPOS64_T uSizeRead_1;
  uLong uSizeRead;
  uLong uL;
  long lSeek;
  uLong uMagic;
  ZPOS64_T ZStack_d8;
  int err;
  unz_file_info64_internal file_info_internal;
  unz_file_info64 file_info;
  unz64_s *s;
  void *extraField_local;
  uLong fileNameBufferSize_local;
  char *szFileName_local;
  unz_file_info64_internal *pfile_info_internal_local;
  unz_file_info64 *pfile_info_local;
  unzFile file_local;
  
  uMagic._4_4_ = 0;
  uL = 0;
  if (file == (unzFile)0x0) {
    file_local._4_4_ = -0x66;
  }
  else {
    file_info.tmu_date._16_8_ = file;
    lVar2 = call_zseek64((zlib_filefunc64_32_def *)file,*(voidpf *)((long)file + 0x60),
                         *(long *)((long)file + 0x88) + *(long *)((long)file + 0x78),0);
    if (lVar2 != 0) {
      uMagic._4_4_ = -1;
    }
    if (uMagic._4_4_ == 0) {
      iVar1 = unz64local_getLong((zlib_filefunc64_32_def *)file_info.tmu_date._16_8_,
                                 *(voidpf *)(file_info.tmu_date._16_8_ + 0x60),(uLong *)&lSeek);
      if (iVar1 == 0) {
        if (lSeek != 0x2014b50) {
          uMagic._4_4_ = -0x67;
        }
      }
      else {
        uMagic._4_4_ = -1;
      }
    }
    iVar1 = unz64local_getShort((zlib_filefunc64_32_def *)file_info.tmu_date._16_8_,
                                *(voidpf *)(file_info.tmu_date._16_8_ + 0x60),
                                &file_info_internal.offset_curfile);
    if (iVar1 != 0) {
      uMagic._4_4_ = -1;
    }
    iVar1 = unz64local_getShort((zlib_filefunc64_32_def *)file_info.tmu_date._16_8_,
                                *(voidpf *)(file_info.tmu_date._16_8_ + 0x60),&file_info.version);
    if (iVar1 != 0) {
      uMagic._4_4_ = -1;
    }
    iVar1 = unz64local_getShort((zlib_filefunc64_32_def *)file_info.tmu_date._16_8_,
                                *(voidpf *)(file_info.tmu_date._16_8_ + 0x60),
                                &file_info.version_needed);
    if (iVar1 != 0) {
      uMagic._4_4_ = -1;
    }
    iVar1 = unz64local_getShort((zlib_filefunc64_32_def *)file_info.tmu_date._16_8_,
                                *(voidpf *)(file_info.tmu_date._16_8_ + 0x60),&file_info.flag);
    if (iVar1 != 0) {
      uMagic._4_4_ = -1;
    }
    iVar1 = unz64local_getLong((zlib_filefunc64_32_def *)file_info.tmu_date._16_8_,
                               *(voidpf *)(file_info.tmu_date._16_8_ + 0x60),
                               &file_info.compression_method);
    if (iVar1 != 0) {
      uMagic._4_4_ = -1;
    }
    unz64local_DosDateToTmuDate(file_info.compression_method,(tm_unz *)&file_info.external_fa);
    iVar1 = unz64local_getLong((zlib_filefunc64_32_def *)file_info.tmu_date._16_8_,
                               *(voidpf *)(file_info.tmu_date._16_8_ + 0x60),&file_info.dosDate);
    if (iVar1 != 0) {
      uMagic._4_4_ = -1;
    }
    iVar1 = unz64local_getLong((zlib_filefunc64_32_def *)file_info.tmu_date._16_8_,
                               *(voidpf *)(file_info.tmu_date._16_8_ + 0x60),&uSizeRead);
    if (iVar1 != 0) {
      uMagic._4_4_ = -1;
    }
    file_info.crc = uSizeRead;
    iVar1 = unz64local_getLong((zlib_filefunc64_32_def *)file_info.tmu_date._16_8_,
                               *(voidpf *)(file_info.tmu_date._16_8_ + 0x60),&uSizeRead);
    if (iVar1 != 0) {
      uMagic._4_4_ = -1;
    }
    file_info.compressed_size = uSizeRead;
    iVar1 = unz64local_getShort((zlib_filefunc64_32_def *)file_info.tmu_date._16_8_,
                                *(voidpf *)(file_info.tmu_date._16_8_ + 0x60),
                                &file_info.uncompressed_size);
    if (iVar1 != 0) {
      uMagic._4_4_ = -1;
    }
    iVar1 = unz64local_getShort((zlib_filefunc64_32_def *)file_info.tmu_date._16_8_,
                                *(voidpf *)(file_info.tmu_date._16_8_ + 0x60),
                                &file_info.size_filename);
    if (iVar1 != 0) {
      uMagic._4_4_ = -1;
    }
    iVar1 = unz64local_getShort((zlib_filefunc64_32_def *)file_info.tmu_date._16_8_,
                                *(voidpf *)(file_info.tmu_date._16_8_ + 0x60),
                                &file_info.size_file_extra);
    if (iVar1 != 0) {
      uMagic._4_4_ = -1;
    }
    iVar1 = unz64local_getShort((zlib_filefunc64_32_def *)file_info.tmu_date._16_8_,
                                *(voidpf *)(file_info.tmu_date._16_8_ + 0x60),
                                &file_info.size_file_comment);
    if (iVar1 != 0) {
      uMagic._4_4_ = -1;
    }
    iVar1 = unz64local_getShort((zlib_filefunc64_32_def *)file_info.tmu_date._16_8_,
                                *(voidpf *)(file_info.tmu_date._16_8_ + 0x60),
                                &file_info.disk_num_start);
    if (iVar1 != 0) {
      uMagic._4_4_ = -1;
    }
    iVar1 = unz64local_getLong((zlib_filefunc64_32_def *)file_info.tmu_date._16_8_,
                               *(voidpf *)(file_info.tmu_date._16_8_ + 0x60),&file_info.internal_fa)
    ;
    if (iVar1 != 0) {
      uMagic._4_4_ = -1;
    }
    iVar1 = unz64local_getLong((zlib_filefunc64_32_def *)file_info.tmu_date._16_8_,
                               *(voidpf *)(file_info.tmu_date._16_8_ + 0x60),&uSizeRead);
    if (iVar1 != 0) {
      uMagic._4_4_ = -1;
    }
    ZStack_d8 = uSizeRead;
    uL = file_info.uncompressed_size + uL;
    if ((uMagic._4_4_ == 0) && (szFileName != (char *)0x0)) {
      uSizeRead_1 = fileNameBufferSize;
      if (file_info.uncompressed_size < fileNameBufferSize) {
        szFileName[file_info.uncompressed_size] = '\0';
        uSizeRead_1 = file_info.uncompressed_size;
      }
      if (((file_info.uncompressed_size != 0) && (fileNameBufferSize != 0)) &&
         (ZVar3 = (**(code **)(file_info.tmu_date._16_8_ + 8))
                            (*(undefined8 *)(file_info.tmu_date._16_8_ + 0x38),
                             *(undefined8 *)(file_info.tmu_date._16_8_ + 0x60),szFileName,
                             uSizeRead_1), ZVar3 != uSizeRead_1)) {
        uMagic._4_4_ = -1;
      }
      uL = uL - uSizeRead_1;
    }
    if ((uMagic._4_4_ == 0) && (extraField != (void *)0x0)) {
      if (file_info.size_filename < extraFieldBufferSize) {
        acc = file_info.size_filename;
      }
      else {
        acc = extraFieldBufferSize;
      }
      if (uL != 0) {
        lVar2 = call_zseek64((zlib_filefunc64_32_def *)file_info.tmu_date._16_8_,
                             *(voidpf *)(file_info.tmu_date._16_8_ + 0x60),uL,1);
        if (lVar2 == 0) {
          uL = 0;
        }
        else {
          uMagic._4_4_ = -1;
        }
      }
      if (((file_info.size_filename != 0) && (extraFieldBufferSize != 0)) &&
         (uVar4 = (**(code **)(file_info.tmu_date._16_8_ + 8))
                            (*(undefined8 *)(file_info.tmu_date._16_8_ + 0x38),
                             *(undefined8 *)(file_info.tmu_date._16_8_ + 0x60),extraField,acc),
         uVar4 != acc)) {
        uMagic._4_4_ = -1;
      }
      uL = (file_info.size_filename - acc) + uL;
    }
    else {
      uL = file_info.size_filename + uL;
    }
    if ((uMagic._4_4_ == 0) && (file_info.size_filename != 0)) {
      headerId = 0;
      uL = uL - file_info.size_filename;
      if (uL != 0) {
        lVar2 = call_zseek64((zlib_filefunc64_32_def *)file_info.tmu_date._16_8_,
                             *(voidpf *)(file_info.tmu_date._16_8_ + 0x60),uL,1);
        if (lVar2 == 0) {
          uL = 0;
        }
        else {
          uMagic._4_4_ = -1;
        }
      }
      for (; headerId < file_info.size_filename; headerId = uSizeRead_2 + 4 + headerId) {
        iVar1 = unz64local_getShort((zlib_filefunc64_32_def *)file_info.tmu_date._16_8_,
                                    *(voidpf *)(file_info.tmu_date._16_8_ + 0x60),&dataSize);
        if (iVar1 != 0) {
          uMagic._4_4_ = -1;
        }
        iVar1 = unz64local_getShort((zlib_filefunc64_32_def *)file_info.tmu_date._16_8_,
                                    *(voidpf *)(file_info.tmu_date._16_8_ + 0x60),&uSizeRead_2);
        if (iVar1 != 0) {
          uMagic._4_4_ = -1;
        }
        if (dataSize == 1) {
          if ((file_info.compressed_size == 0xffffffffffffffff) &&
             (iVar1 = unz64local_getLong64
                                ((zlib_filefunc64_32_def *)file_info.tmu_date._16_8_,
                                 *(voidpf *)(file_info.tmu_date._16_8_ + 0x60),
                                 &file_info.compressed_size), iVar1 != 0)) {
            uMagic._4_4_ = -1;
          }
          if ((file_info.crc == 0xffffffffffffffff) &&
             (iVar1 = unz64local_getLong64
                                ((zlib_filefunc64_32_def *)file_info.tmu_date._16_8_,
                                 *(voidpf *)(file_info.tmu_date._16_8_ + 0x60),&file_info.crc),
             iVar1 != 0)) {
            uMagic._4_4_ = -1;
          }
          if ((ZStack_d8 == 0xffffffffffffffff) &&
             (iVar1 = unz64local_getLong64
                                ((zlib_filefunc64_32_def *)file_info.tmu_date._16_8_,
                                 *(voidpf *)(file_info.tmu_date._16_8_ + 0x60),
                                 &stack0xffffffffffffff28), iVar1 != 0)) {
            uMagic._4_4_ = -1;
          }
          if ((file_info.size_file_comment == 0xffffffffffffffff) &&
             (iVar1 = unz64local_getLong((zlib_filefunc64_32_def *)file_info.tmu_date._16_8_,
                                         *(voidpf *)(file_info.tmu_date._16_8_ + 0x60),&uSizeRead),
             iVar1 != 0)) {
            uMagic._4_4_ = -1;
          }
        }
        else {
          lVar2 = call_zseek64((zlib_filefunc64_32_def *)file_info.tmu_date._16_8_,
                               *(voidpf *)(file_info.tmu_date._16_8_ + 0x60),uSizeRead_2,1);
          if (lVar2 != 0) {
            uMagic._4_4_ = -1;
          }
        }
      }
    }
    if ((uMagic._4_4_ == 0) && (szComment != (char *)0x0)) {
      if (file_info.size_file_extra < commentBufferSize) {
        szComment[file_info.size_file_extra] = '\0';
        local_128 = file_info.size_file_extra;
      }
      else {
        local_128 = commentBufferSize;
      }
      if (uL != 0) {
        lVar2 = call_zseek64((zlib_filefunc64_32_def *)file_info.tmu_date._16_8_,
                             *(voidpf *)(file_info.tmu_date._16_8_ + 0x60),uL,1);
        if (lVar2 == 0) {
          uL = 0;
        }
        else {
          uMagic._4_4_ = -1;
        }
      }
      if (((file_info.size_file_extra != 0) && (commentBufferSize != 0)) &&
         (uVar4 = (**(code **)(file_info.tmu_date._16_8_ + 8))
                            (*(undefined8 *)(file_info.tmu_date._16_8_ + 0x38),
                             *(undefined8 *)(file_info.tmu_date._16_8_ + 0x60),szComment,local_128),
         uVar4 != local_128)) {
        uMagic._4_4_ = -1;
      }
      uL = (file_info.size_file_extra - local_128) + uL;
    }
    else {
      uL = file_info.size_file_extra + uL;
    }
    if ((uMagic._4_4_ == 0) && (pfile_info != (unz_file_info64 *)0x0)) {
      memcpy(pfile_info,&file_info_internal,0x88);
    }
    if ((uMagic._4_4_ == 0) && (pfile_info_internal != (unz_file_info64_internal *)0x0)) {
      pfile_info_internal->offset_curfile = ZStack_d8;
    }
    file_local._4_4_ = uMagic._4_4_;
  }
  return file_local._4_4_;
}

Assistant:

local int unz64local_GetCurrentFileInfoInternal(unzFile file,
    unz_file_info64* pfile_info,
    unz_file_info64_internal
    * pfile_info_internal,
    char* szFileName,
    uLong fileNameBufferSize,
    void* extraField,
    uLong extraFieldBufferSize,
    char* szComment,
    uLong commentBufferSize)
{
    unz64_s* s;
    unz_file_info64 file_info;
    unz_file_info64_internal file_info_internal;
    int err = UNZ_OK;
    uLong uMagic;
    long lSeek = 0;
    uLong uL;

    if (file == NULL)
        return UNZ_PARAMERROR;
    s = (unz64_s*)file;
    if (ZSEEK64(s->z_filefunc, s->filestream,
        s->pos_in_central_dir + s->byte_before_the_zipfile,
        ZLIB_FILEFUNC_SEEK_SET) != 0)
        err = UNZ_ERRNO;


    /* we check the magic */
    if (err == UNZ_OK)
    {
        if (unz64local_getLong(&s->z_filefunc, s->filestream, &uMagic) != UNZ_OK)
            err = UNZ_ERRNO;
        else if (uMagic != 0x02014b50)
            err = UNZ_BADZIPFILE;
    }

    if (unz64local_getShort(&s->z_filefunc, s->filestream, &file_info.version) != UNZ_OK)
        err = UNZ_ERRNO;

    if (unz64local_getShort(&s->z_filefunc, s->filestream, &file_info.version_needed) != UNZ_OK)
        err = UNZ_ERRNO;

    if (unz64local_getShort(&s->z_filefunc, s->filestream, &file_info.flag) != UNZ_OK)
        err = UNZ_ERRNO;

    if (unz64local_getShort(&s->z_filefunc, s->filestream, &file_info.compression_method) != UNZ_OK)
        err = UNZ_ERRNO;

    if (unz64local_getLong(&s->z_filefunc, s->filestream, &file_info.dosDate) != UNZ_OK)
        err = UNZ_ERRNO;

    unz64local_DosDateToTmuDate(file_info.dosDate, &file_info.tmu_date);

    if (unz64local_getLong(&s->z_filefunc, s->filestream, &file_info.crc) != UNZ_OK)
        err = UNZ_ERRNO;

    if (unz64local_getLong(&s->z_filefunc, s->filestream, &uL) != UNZ_OK)
        err = UNZ_ERRNO;
    file_info.compressed_size = uL;

    if (unz64local_getLong(&s->z_filefunc, s->filestream, &uL) != UNZ_OK)
        err = UNZ_ERRNO;
    file_info.uncompressed_size = uL;

    if (unz64local_getShort(&s->z_filefunc, s->filestream, &file_info.size_filename) != UNZ_OK)
        err = UNZ_ERRNO;

    if (unz64local_getShort(&s->z_filefunc, s->filestream, &file_info.size_file_extra) != UNZ_OK)
        err = UNZ_ERRNO;

    if (unz64local_getShort(&s->z_filefunc, s->filestream, &file_info.size_file_comment) != UNZ_OK)
        err = UNZ_ERRNO;

    if (unz64local_getShort(&s->z_filefunc, s->filestream, &file_info.disk_num_start) != UNZ_OK)
        err = UNZ_ERRNO;

    if (unz64local_getShort(&s->z_filefunc, s->filestream, &file_info.internal_fa) != UNZ_OK)
        err = UNZ_ERRNO;

    if (unz64local_getLong(&s->z_filefunc, s->filestream, &file_info.external_fa) != UNZ_OK)
        err = UNZ_ERRNO;

    // relative offset of local header
    if (unz64local_getLong(&s->z_filefunc, s->filestream, &uL) != UNZ_OK)
        err = UNZ_ERRNO;
    file_info_internal.offset_curfile = uL;

    lSeek += file_info.size_filename;
    if ((err == UNZ_OK) && (szFileName != NULL))
    {
        uLong uSizeRead;
        if (file_info.size_filename < fileNameBufferSize)
        {
            *(szFileName + file_info.size_filename) = '\0';
            uSizeRead = file_info.size_filename;
        }
        else
            uSizeRead = fileNameBufferSize;

        if ((file_info.size_filename > 0) && (fileNameBufferSize > 0))
            if (ZREAD64(s->z_filefunc, s->filestream, szFileName, uSizeRead) != uSizeRead)
                err = UNZ_ERRNO;
        lSeek -= uSizeRead;
    }

    // Read extrafield
    if ((err == UNZ_OK) && (extraField != NULL))
    {
        ZPOS64_T uSizeRead;
        if (file_info.size_file_extra < extraFieldBufferSize)
            uSizeRead = file_info.size_file_extra;
        else
            uSizeRead = extraFieldBufferSize;

        if (lSeek != 0)
        {
            if (ZSEEK64(s->z_filefunc, s->filestream, lSeek, ZLIB_FILEFUNC_SEEK_CUR) == 0)
                lSeek = 0;
            else
                err = UNZ_ERRNO;
        }

        if ((file_info.size_file_extra > 0) && (extraFieldBufferSize > 0))
            if (ZREAD64(s->z_filefunc, s->filestream, extraField, (uLong)uSizeRead) != uSizeRead)
                err = UNZ_ERRNO;

        lSeek += file_info.size_file_extra - (uLong)uSizeRead;
    }
    else
        lSeek += file_info.size_file_extra;


    if ((err == UNZ_OK) && (file_info.size_file_extra != 0))
    {
        uLong acc = 0;

        // since lSeek now points to after the extra field we need to move back
        lSeek -= file_info.size_file_extra;

        if (lSeek != 0)
        {
            if (ZSEEK64(s->z_filefunc, s->filestream, lSeek, ZLIB_FILEFUNC_SEEK_CUR) == 0)
                lSeek = 0;
            else
                err = UNZ_ERRNO;
        }

        while (acc < file_info.size_file_extra)
        {
            uLong headerId;
            uLong dataSize;

            if (unz64local_getShort(&s->z_filefunc, s->filestream, &headerId) != UNZ_OK)
                err = UNZ_ERRNO;

            if (unz64local_getShort(&s->z_filefunc, s->filestream, &dataSize) != UNZ_OK)
                err = UNZ_ERRNO;

            /* ZIP64 extra fields */
            if (headerId == 0x0001)
            {
                if (file_info.uncompressed_size == (ZPOS64_T)(unsigned long)-1)
                {
                    if (unz64local_getLong64(&s->z_filefunc, s->filestream, &file_info.uncompressed_size) != UNZ_OK)
                        err = UNZ_ERRNO;
                }

                if (file_info.compressed_size == (ZPOS64_T)(unsigned long)-1)
                {
                    if (unz64local_getLong64(&s->z_filefunc, s->filestream, &file_info.compressed_size) != UNZ_OK)
                        err = UNZ_ERRNO;
                }

                if (file_info_internal.offset_curfile == (ZPOS64_T)(unsigned long)-1)
                {
                    /* Relative Header offset */
                    if (unz64local_getLong64(&s->z_filefunc, s->filestream, &file_info_internal.offset_curfile) != UNZ_OK)
                        err = UNZ_ERRNO;
                }

                if (file_info.disk_num_start == (unsigned long)-1)
                {
                    /* Disk Start Number */
                    if (unz64local_getLong(&s->z_filefunc, s->filestream, &uL) != UNZ_OK)
                        err = UNZ_ERRNO;
                }

            }
            else
            {
                if (ZSEEK64(s->z_filefunc, s->filestream, dataSize, ZLIB_FILEFUNC_SEEK_CUR) != 0)
                    err = UNZ_ERRNO;
            }

            acc += 2 + 2 + dataSize;
        }
    }

    if ((err == UNZ_OK) && (szComment != NULL))
    {
        uLong uSizeRead;
        if (file_info.size_file_comment < commentBufferSize)
        {
            *(szComment + file_info.size_file_comment) = '\0';
            uSizeRead = file_info.size_file_comment;
        }
        else
            uSizeRead = commentBufferSize;

        if (lSeek != 0)
        {
            if (ZSEEK64(s->z_filefunc, s->filestream, lSeek, ZLIB_FILEFUNC_SEEK_CUR) == 0)
                lSeek = 0;
            else
                err = UNZ_ERRNO;
        }

        if ((file_info.size_file_comment > 0) && (commentBufferSize > 0))
            if (ZREAD64(s->z_filefunc, s->filestream, szComment, uSizeRead) != uSizeRead)
                err = UNZ_ERRNO;
        lSeek += file_info.size_file_comment - uSizeRead;
    }
    else
        lSeek += file_info.size_file_comment;


    if ((err == UNZ_OK) && (pfile_info != NULL))
        *pfile_info = file_info;

    if ((err == UNZ_OK) && (pfile_info_internal != NULL))
        *pfile_info_internal = file_info_internal;

    return err;
}